

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O0

size_t JSONWorker::FindNextRelevant<(char)44>(json_string *value_t,size_t pos)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  size_t sVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var5;
  allocator local_121;
  json_string local_120;
  allocator local_f9;
  json_string local_f8;
  allocator local_d1;
  json_string local_d0;
  long local_b0;
  size_t brac_1;
  json_string local_a0;
  allocator local_69;
  json_string local_68;
  long local_48;
  size_t brac;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  const_iterator p;
  const_iterator e;
  const_iterator start;
  size_t pos_local;
  json_string *value_t_local;
  
  e._M_current = (char *)std::__cxx11::string::begin();
  p._M_current = (char *)std::__cxx11::string::end();
  brac = std::__cxx11::string::begin();
  local_38 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator+((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&brac,pos);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&local_38,&p);
    if (!bVar2) {
      return 0xffffffffffffffff;
    }
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_38);
    if (*pcVar3 == ',') break;
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_38);
    cVar1 = *pcVar3;
    if (cVar1 == '\"') {
      while( true ) {
        p_Var5 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(&local_38);
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(p_Var5);
        if (*pcVar3 == '\"') break;
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_38);
        if (*pcVar3 == '\0') {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_120,"Null terminator inside of a quotation",&local_121);
          JSONDebug::_JSON_FAIL(&local_120);
          std::__cxx11::string::~string((string *)&local_120);
          std::allocator<char>::~allocator((allocator<char> *)&local_121);
          return 0xffffffffffffffff;
        }
      }
    }
    else if (cVar1 == '[') {
      local_48 = 1;
      while (local_48 != 0) {
        p_Var5 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(&local_38);
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(p_Var5);
        cVar1 = *pcVar3;
        if (cVar1 == '\0') {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_a0,"Null terminator inside of a bracket",
                     (allocator *)((long)&brac_1 + 7));
          JSONDebug::_JSON_FAIL(&local_a0);
          std::__cxx11::string::~string((string *)&local_a0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&brac_1 + 7));
          return 0xffffffffffffffff;
        }
        if (cVar1 == '\"') {
          while( true ) {
            p_Var5 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator++(&local_38);
            pcVar3 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(p_Var5);
            if (*pcVar3 == '\"') break;
            pcVar3 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_38);
            if (*pcVar3 == '\0') {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_68,"Null terminator inside of a quotation",&local_69);
              JSONDebug::_JSON_FAIL(&local_68);
              std::__cxx11::string::~string((string *)&local_68);
              std::allocator<char>::~allocator((allocator<char> *)&local_69);
              return 0xffffffffffffffff;
            }
          }
        }
        else if (cVar1 == '[') {
          local_48 = local_48 + 1;
        }
        else if (cVar1 == ']') {
          local_48 = local_48 + -1;
        }
      }
    }
    else {
      if (cVar1 == ']') {
        return 0xffffffffffffffff;
      }
      if (cVar1 == '{') {
        local_b0 = 1;
        while (local_b0 != 0) {
          p_Var5 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator++(&local_38);
          pcVar3 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(p_Var5);
          cVar1 = *pcVar3;
          if (cVar1 == '\0') {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_f8,"Null terminator inside of a bracket",&local_f9);
            JSONDebug::_JSON_FAIL(&local_f8);
            std::__cxx11::string::~string((string *)&local_f8);
            std::allocator<char>::~allocator((allocator<char> *)&local_f9);
            return 0xffffffffffffffff;
          }
          if (cVar1 == '\"') {
            while( true ) {
              p_Var5 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator++(&local_38);
              pcVar3 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(p_Var5);
              if (*pcVar3 == '\"') break;
              pcVar3 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_38);
              if (*pcVar3 == '\0') {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_d0,"Null terminator inside of a quotation",&local_d1);
                JSONDebug::_JSON_FAIL(&local_d0);
                std::__cxx11::string::~string((string *)&local_d0);
                std::allocator<char>::~allocator((allocator<char> *)&local_d1);
                return 0xffffffffffffffff;
              }
            }
          }
          else if (cVar1 == '{') {
            local_b0 = local_b0 + 1;
          }
          else if (cVar1 == '}') {
            local_b0 = local_b0 + -1;
          }
        }
      }
      else if (cVar1 == '}') {
        return 0xffffffffffffffff;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_38);
  }
  sVar4 = __gnu_cxx::operator-(&local_38,&e);
  return sVar4;
}

Assistant:

size_t JSONWorker::FindNextRelevant(json_char ch, const json_string & value_t, const size_t pos) json_nothrow {
	#endif
		json_string::const_iterator start = value_t.begin();
		json_string::const_iterator e = value_t.end();
	   for (json_string::const_iterator p = value_t.begin() + pos; p != e; ++p){
		  if (json_unlikely(*p == ch)) return p - start;
		  switch (*p){
				BRACKET(JSON_TEXT('['), JSON_TEXT(']'))
				BRACKET(JSON_TEXT('{'), JSON_TEXT('}'))
				QUOTECASE()
		  }
	   };
	   return json_string::npos;
    }